

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::TightenBoundsPS::execute
          (TightenBoundsPS *this,VectorBase<double> *x,VectorBase<double> *param_2,
          VectorBase<double> *param_3,VectorBase<double> *param_4,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  double dVar2;
  int iVar3;
  VarStatus VVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  
  iVar3 = this->m_j;
  VVar4 = cStatus->data[iVar3];
  if (VVar4 == ON_UPPER) {
    dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
    dVar2 = this->m_origupper;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if (-extraout_XMM0_Qa_04 <= dVar1 - dVar2) {
      return;
    }
  }
  else if (VVar4 == ON_LOWER) {
    dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
    dVar2 = this->m_origlower;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if (dVar1 - dVar2 <= extraout_XMM0_Qa_03) {
      return;
    }
  }
  else {
    if (VVar4 != FIXED) {
      return;
    }
    dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
    dVar2 = this->m_origupper;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if ((-extraout_XMM0_Qa <= dVar1 - dVar2) ||
       (dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_j], dVar2 = this->m_origlower,
       (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar1 - dVar2 <= extraout_XMM0_Qa_00)) {
      dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_j];
      dVar2 = this->m_origupper;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      iVar3 = this->m_j;
      VVar4 = ON_LOWER;
      if (-extraout_XMM0_Qa_01 <= dVar1 - dVar2) {
        dVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar2 = this->m_origlower;
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (dVar1 - dVar2 <= extraout_XMM0_Qa_02) {
          return;
        }
        iVar3 = this->m_j;
        VVar4 = ON_UPPER;
      }
      goto LAB_00201383;
    }
  }
  iVar3 = this->m_j;
  VVar4 = BASIC;
LAB_00201383:
  cStatus->data[iVar3] = VVar4;
  return;
}

Assistant:

void SPxMainSM<R>::TightenBoundsPS::execute(VectorBase<R>& x, VectorBase<R>&, VectorBase<R>&,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // basis:
   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(LT(x[m_j], m_origupper, this->feastol()) && GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
      else if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;

      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}